

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageEllipse(gdImagePtr im,int mx,int my,int w,int h,int c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int x;
  long lVar4;
  int x_00;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_50;
  undefined8 local_48;
  
  local_5c = w >> 1;
  lVar4 = (long)local_5c;
  x = local_5c + mx;
  gdImageSetPixel(im,x,my,c);
  x_00 = mx - local_5c;
  gdImageSetPixel(im,x_00,my,c);
  lVar1 = (long)(h >> 1) * (long)(h >> 1);
  lVar2 = lVar1 * lVar4;
  local_50 = lVar2 * 2;
  local_48 = 0;
  local_60 = my;
  do {
    if (local_5c < 1) {
      return;
    }
    lVar3 = lVar2;
    if (lVar2 < 1) {
LAB_0010dd7a:
      local_5c = local_5c + -1;
      x_00 = x_00 + 1;
      x = x + -1;
      local_50 = local_50 + lVar1 * -2;
      lVar3 = lVar3 + local_50;
    }
    else {
      my = my + 1;
      local_60 = local_60 + -1;
      local_48 = local_48 + lVar4 * lVar4 * 2;
      lVar3 = lVar2 - local_48;
      if (lVar3 == 0 || lVar2 < local_48) goto LAB_0010dd7a;
    }
    gdImageSetPixel(im,x_00,my,c);
    gdImageSetPixel(im,x_00,local_60,c);
    gdImageSetPixel(im,x,my,c);
    gdImageSetPixel(im,x,local_60,c);
    lVar2 = lVar3;
  } while( true );
}

Assistant:

BGD_DECLARE(void) gdImageEllipse(gdImagePtr im, int mx, int my, int w, int h, int c)
{
	int x=0,mx1=0,mx2=0,my1=0,my2=0;
	long aq,bq,dx,dy,r,rx,ry,a,b;

	a=w>>1;
	b=h>>1;
	gdImageSetPixel(im,mx+a, my, c);
	gdImageSetPixel(im,mx-a, my, c);
	mx1 = mx-a;
	my1 = my;
	mx2 = mx+a;
	my2 = my;

	aq = a * a;
	bq = b * b;
	dx = aq << 1;
	dy = bq << 1;
	r  = a * bq;
	rx = r << 1;
	ry = 0;
	x = a;
	while (x > 0) {
		if (r > 0) {
			my1++;
			my2--;
			ry +=dx;
			r  -=ry;
		}
		if (r <= 0) {
			x--;
			mx1++;
			mx2--;
			rx -=dy;
			r  +=rx;
		}
		gdImageSetPixel(im,mx1, my1, c);
		gdImageSetPixel(im,mx1, my2, c);
		gdImageSetPixel(im,mx2, my1, c);
		gdImageSetPixel(im,mx2, my2, c);
	}
}